

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

Vec_Int_t * Supp_ManTransferEntry(Supp_One_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = p->nOuts;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  p_00->pArray = piVar2;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      Vec_IntPush(p_00,(&p[1].nRefs)[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < p->nOuts);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Supp_ManTransferEntry( Supp_One_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    vSupp = Vec_IntAlloc( p->nOuts );
    for ( i = 0; i < p->nOuts; i++ )
        Vec_IntPush( vSupp, p->pOuts[i] );
    return vSupp;
}